

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O3

tmbstr prvTidyPutUTF8(tmbstr buf,uint c)

{
  int iVar1;
  long lVar2;
  int local_c;
  
  local_c = 0;
  iVar1 = prvTidyEncodeCharToUTF8Bytes(c,buf,(TidyOutputSink *)0x0,&local_c);
  if (iVar1 == 0) {
    lVar2 = (long)local_c;
  }
  else {
    buf[0] = -0x11;
    buf[1] = -0x41;
    buf[2] = -0x43;
    lVar2 = 3;
  }
  return buf + lVar2;
}

Assistant:

tmbstr TY_(PutUTF8)( tmbstr buf, uint c )
{
    int err, count = 0;
        
    err = TY_(EncodeCharToUTF8Bytes)( c, buf, NULL, &count );
    if (err)
    {
#if 1 && defined(_DEBUG)
        fprintf(stderr, "pprint UTF-8 encoding error for U+%x : ", c);
#endif
        /* replacement char 0xFFFD encoded as UTF-8 */
        buf[0] = (byte) 0xEF;
        buf[1] = (byte) 0xBF;
        buf[2] = (byte) 0xBD;
        count = 3;
    }
    
    buf += count;
    return buf;
}